

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

MixingHashState
absl::lts_20240722::hash_internal::HashStateBase<absl::lts_20240722::hash_internal::MixingHashState>
::combine<google::protobuf::MessageLite_const*,int>
          (MixingHashState state,MessageLite **value,int *values)

{
  undefined1 auVar1 [16];
  enable_if_t<std::is_same<MixingHashState,_decltype(AbslHashValue(std::move(state),_value))>::value,_absl::lts_20240722::hash_internal::MixingHashState>
  eVar2;
  uchar *start;
  
  eVar2 = HashSelect::HashValueProbe::
          Invoke<absl::lts_20240722::hash_internal::MixingHashState,google::protobuf::MessageLite_const*>
                    (state,value);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = eVar2.state_ + (uint)*values;
  return (MixingHashState)
         (SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8));
}

Assistant:

H HashStateBase<H>::combine(H state, const T& value, const Ts&... values) {
  return H::combine(hash_internal::HashSelect::template Apply<T>::Invoke(
                        std::move(state), value),
                    values...);
}